

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,BlockNode *node)

{
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)&node->statements_;
  while (p_Var1 = (((_List_base<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&node->statements_) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x10))(p_Var1[1]._M_next,this);
  }
  return;
}

Assistant:

void Executor::visit(const BlockNode& node)
{
  for(const auto& statement: node.getStatements())
   statement->accept(*this);
}